

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O0

void proto3_arena_unittest::NestedTestAllTypes::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  NestedTestAllTypes **v1;
  NestedTestAllTypes **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes> *this;
  RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes> *other;
  uint32_t *puVar3;
  NestedTestAllTypes *pNVar4;
  TestAllTypes *pTVar5;
  LogMessage local_e0;
  Voidify local_ca;
  byte local_c9;
  LogMessage local_c8;
  Voidify local_b2;
  byte local_b1;
  LogMessage local_b0;
  Voidify local_99;
  uint local_98;
  uint32_t cached_has_bits;
  LogMessage local_88;
  Voidify local_71;
  NestedTestAllTypes *local_70;
  Nullable<const_char_*> local_68;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  NestedTestAllTypes *from;
  NestedTestAllTypes *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_30;
  char *local_28;
  Nullable<const_char_*> local_20;
  char *local_18;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (NestedTestAllTypes *)to_msg;
  _this = (NestedTestAllTypes *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_70 = (NestedTestAllTypes *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto3_arena_unittest::NestedTestAllTypes_const*>(&local_70);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto3_arena_unittest::NestedTestAllTypes*>(&from);
  local_68 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto3_arena_unittest::NestedTestAllTypes_const*,proto3_arena_unittest::NestedTestAllTypes*>
                       (v1,v2,"&from != _this");
  if (local_68 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_68);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
               ,0x130b,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_71,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_88);
  }
  local_98 = 0;
  this = _internal_mutable_repeated_child(from);
  other = _internal_repeated_child((NestedTestAllTypes *)arena);
  google::protobuf::RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes>::MergeFrom
            (this,other);
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  local_98 = *puVar3;
  if ((local_98 & 7) != 0) {
    if ((local_98 & 1) != 0) {
      local_b1 = 0;
      if ((arena->impl_).first_arena_.ptr_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0x1314,"from._impl_.child_ != nullptr");
        local_b1 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_99,pLVar2);
      }
      if ((local_b1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b0);
      }
      if ((from->field_0)._impl_.child_ == (NestedTestAllTypes *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.ptr_._M_b._M_p;
        local_30 = absl_log_internal_check_op_result;
        pNVar4 = (NestedTestAllTypes *)
                 google::protobuf::Arena::CopyConstruct<proto3_arena_unittest::NestedTestAllTypes>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.child_ = pNVar4;
      }
      else {
        MergeFrom((from->field_0)._impl_.child_,
                  (NestedTestAllTypes *)(arena->impl_).first_arena_.ptr_._M_b._M_p);
      }
    }
    if ((local_98 & 2) != 0) {
      local_c9 = 0;
      if ((arena->impl_).first_arena_.limit_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0x131c,"from._impl_.payload_ != nullptr");
        local_c9 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_b2,pLVar2);
      }
      if ((local_c9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_c8);
      }
      if ((from->field_0)._impl_.payload_ == (TestAllTypes *)0x0) {
        local_18 = (arena->impl_).first_arena_.limit_;
        local_10 = absl_log_internal_check_op_result;
        pTVar5 = (TestAllTypes *)
                 google::protobuf::Arena::CopyConstruct<proto3_arena_unittest::TestAllTypes>
                           ((Arena *)absl_log_internal_check_op_result,local_18);
        (from->field_0)._impl_.payload_ = pTVar5;
      }
      else {
        proto3_arena_unittest::TestAllTypes::MergeFrom
                  ((from->field_0)._impl_.payload_,
                   (TestAllTypes *)(arena->impl_).first_arena_.limit_);
      }
    }
    if ((local_98 & 4) != 0) {
      if ((arena->impl_).first_arena_.prefetch_ptr_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0x1324,"from._impl_.lazy_payload_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_ca,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_e0);
      }
      if ((from->field_0)._impl_.lazy_payload_ == (TestAllTypes *)0x0) {
        local_28 = (arena->impl_).first_arena_.prefetch_ptr_;
        local_20 = absl_log_internal_check_op_result;
        pTVar5 = (TestAllTypes *)
                 google::protobuf::Arena::CopyConstruct<proto3_arena_unittest::TestAllTypes>
                           ((Arena *)absl_log_internal_check_op_result,local_28);
        (from->field_0)._impl_.lazy_payload_ = pTVar5;
      }
      else {
        proto3_arena_unittest::TestAllTypes::MergeFrom
                  ((from->field_0)._impl_.lazy_payload_,
                   (TestAllTypes *)(arena->impl_).first_arena_.prefetch_ptr_);
      }
    }
  }
  uVar1 = local_98;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void NestedTestAllTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<NestedTestAllTypes*>(&to_msg);
  auto& from = static_cast<const NestedTestAllTypes&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_arena_unittest.NestedTestAllTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_child()->MergeFrom(
      from._internal_repeated_child());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.child_ != nullptr);
      if (_this->_impl_.child_ == nullptr) {
        _this->_impl_.child_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.child_);
      } else {
        _this->_impl_.child_->MergeFrom(*from._impl_.child_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.payload_ != nullptr);
      if (_this->_impl_.payload_ == nullptr) {
        _this->_impl_.payload_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.payload_);
      } else {
        _this->_impl_.payload_->MergeFrom(*from._impl_.payload_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.lazy_payload_ != nullptr);
      if (_this->_impl_.lazy_payload_ == nullptr) {
        _this->_impl_.lazy_payload_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.lazy_payload_);
      } else {
        _this->_impl_.lazy_payload_->MergeFrom(*from._impl_.lazy_payload_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}